

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPML_DIGEST_Unmarshal(TPML_DIGEST *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal(&target->count,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0x95;
    if (0xfffffff8 < target->count - 9) {
      TVar1 = TPM2B_DIGEST_Array_Unmarshal(target->digests,buffer,size,target->count);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPML_DIGEST_Unmarshal(TPML_DIGEST *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if( (target->count < 2))
        return TPM_RC_SIZE;
    if((target->count) > 8)
        return TPM_RC_SIZE;
    result = TPM2B_DIGEST_Array_Unmarshal((TPM2B_DIGEST *)(target->digests), buffer, size, (INT32)(target->count));
    return result;
}